

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

protobuf_test_messages_proto3_TestAllTypesProto3 *
upb_test_optional_msg_ext(upb_test_TestExtensions *msg)

{
  bool bVar1;
  upb_FieldRep uVar2;
  protobuf_test_messages_proto3_TestAllTypesProto3 *local_28;
  protobuf_test_messages_proto3_TestAllTypesProto3 *ret;
  protobuf_test_messages_proto3_TestAllTypesProto3 *default_val;
  upb_MiniTableExtension *ext;
  upb_test_TestExtensions *msg_local;
  
  default_val = (protobuf_test_messages_proto3_TestAllTypesProto3 *)&upb_test_optional_msg_ext_ext;
  ext = (upb_MiniTableExtension *)msg;
  bVar1 = upb_MiniTableField_IsScalar
                    (&upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xca4,
                  "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)default_val);
  if (uVar2 == kUpb_FieldRep_8Byte) {
    ret = (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0;
    _upb_Message_GetExtensionField
              ((upb_Message *)ext,(upb_MiniTableExtension *)default_val,&ret,&local_28);
    return local_28;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                ,0xca6,
                "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
               );
}

Assistant:

UPB_INLINE const struct protobuf_test_messages_proto3_TestAllTypesProto3* upb_test_optional_msg_ext(const struct upb_test_TestExtensions* msg) {
  const upb_MiniTableExtension* ext = &upb_test_optional_msg_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  const struct protobuf_test_messages_proto3_TestAllTypesProto3* default_val = NULL;
  const struct protobuf_test_messages_proto3_TestAllTypesProto3* ret;
  _upb_Message_GetExtensionField((upb_Message*)msg, ext, &default_val, &ret);
  return ret;
}